

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtOidc.cpp
# Opt level: O0

Url * __thiscall Vault::JwtOidc::getUrl(Url *__return_storage_ptr__,JwtOidc *this,Path *path)

{
  long *plVar1;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Path *local_20;
  Path *path_local;
  JwtOidc *this_local;
  
  plVar1 = *(long **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (JwtOidc *)__return_storage_ptr__;
  Vault::operator+(&local_60,"/v1/auth/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 8));
  std::operator+(&local_40,&local_60,"/");
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::JwtOidc::getUrl(const Path &path) const {
  return client_.getUrl("/v1/auth/" + mount_ + "/", path);
}